

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

Vec_Ptr_t * Aig_ManDfsPreorder(Aig_Man_t *p,int fNodesOnly)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  
  Aig_ManIncrementTravId(p);
  pAVar7 = p->pConst1;
  iVar1 = p->nTravIds;
  pAVar7->TravId = iVar1;
  iVar2 = p->vObjs->nSize;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar2 - 1U) {
    iVar8 = iVar2;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar8 << 3);
  }
  vNodes->pArray = ppvVar3;
  if (fNodesOnly == 0) {
    if (iVar8 == 0) {
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,0x80);
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = 0x10;
    }
    vNodes->nSize = 1;
    *vNodes->pArray = pAVar7;
  }
  else {
    lVar4 = (long)p->vCis->nSize;
    if (0 < lVar4) {
      ppvVar3 = p->vCis->pArray;
      lVar6 = 0;
      do {
        *(int *)((long)ppvVar3[lVar6] + 0x20) = iVar1;
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pAVar7 = (Aig_Obj_t *)pVVar5->pArray[lVar4];
      if (fNodesOnly != 0) {
        pAVar7 = (Aig_Obj_t *)((ulong)pAVar7->pFanin0 & 0xfffffffffffffffe);
      }
      Aig_ManDfsPreorder_rec(p,pAVar7,vNodes);
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  if (fNodesOnly == 0) {
    if (vNodes->nSize != p->vObjs->nSize - p->nDeleted) {
      __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x124,"Vec_Ptr_t *Aig_ManDfsPreorder(Aig_Man_t *, int)");
    }
  }
  else if (vNodes->nSize != p->nObjs[6] + p->nObjs[5]) {
    __assert_fail("Vec_PtrSize(vNodes) == Aig_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x122,"Vec_Ptr_t *Aig_ManDfsPreorder(Aig_Man_t *, int)");
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsPreorder( Aig_Man_t * p, int fNodesOnly )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // mark PIs if they should not be collected
    if ( fNodesOnly )
        Aig_ManForEachCi( p, pObj, i )
            Aig_ObjSetTravIdCurrent( p, pObj );
    else
        Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsPreorder_rec( p, fNodesOnly? Aig_ObjFanin0(pObj): pObj, vNodes );
    if ( fNodesOnly )
        assert( Vec_PtrSize(vNodes) == Aig_ManNodeNum(p) );
    else
        assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}